

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ehooks.c
# Opt level: O1

void * duckdb_je_ehooks_default_alloc_impl
                 (tsdn_t *tsdn,void *new_addr,size_t size,size_t alignment,_Bool *zero,_Bool *commit
                 ,uint arena_ind)

{
  uint uVar1;
  void *pvVar2;
  arena_t *arena;
  
  arena = (arena_t *)duckdb_je_arenas[arena_ind].repr;
  if (arena == (arena_t *)0x0) {
    arena = (arena_t *)0x0;
  }
  if (arena == (arena_t *)0x0) {
    uVar1 = 0;
  }
  else {
    uVar1 = (arena->dss_prec).repr;
  }
  if ((uVar1 == 1) &&
     (pvVar2 = duckdb_je_extent_alloc_dss(tsdn,arena,new_addr,size,alignment,zero,commit),
     pvVar2 != (void *)0x0)) {
    return pvVar2;
  }
  pvVar2 = duckdb_je_extent_alloc_mmap(new_addr,size,alignment,zero,commit);
  if (pvVar2 == (void *)0x0) {
    if ((uVar1 == 2) &&
       (pvVar2 = duckdb_je_extent_alloc_dss(tsdn,arena,new_addr,size,alignment,zero,commit),
       pvVar2 != (void *)0x0)) {
      return pvVar2;
    }
    pvVar2 = (void *)0x0;
  }
  return pvVar2;
}

Assistant:

void *
ehooks_default_alloc_impl(tsdn_t *tsdn, void *new_addr, size_t size,
    size_t alignment, bool *zero, bool *commit, unsigned arena_ind) {
	arena_t *arena = arena_get(tsdn, arena_ind, false);
	/* NULL arena indicates arena_create. */
	assert(arena != NULL || alignment == HUGEPAGE);
	dss_prec_t dss = (arena == NULL) ? dss_prec_disabled :
	    (dss_prec_t)atomic_load_u(&arena->dss_prec, ATOMIC_RELAXED);
	void *ret = extent_alloc_core(tsdn, arena, new_addr, size, alignment,
	    zero, commit, dss);
	if (have_madvise_huge && ret) {
		pages_set_thp_state(ret, size);
	}
	return ret;
}